

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

uint32_t __thiscall capnp::ConstSchema::getValueSchemaOffset(ConstSchema *this)

{
  uint32_t uVar1;
  StructReader local_98;
  StructReader local_68;
  PointerReader local_38;
  
  local_68.data = ((this->super_Schema).raw)->generic->encodedNode;
  local_68.segment = (SegmentReader *)0x0;
  local_68.capTable = (CapTableReader *)0x0;
  local_68.pointers._0_4_ = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_98,(PointerReader *)&local_68,(word *)0x0);
  local_38.pointer = (WirePointer *)0x0;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  if (4 < local_98.pointerCount) {
    local_38.pointer = local_98.pointers + 4;
    local_38.segment = local_98.segment;
    local_38.capTable = local_98.capTable;
    local_38.nestingLimit = local_98.nestingLimit;
  }
  capnp::_::PointerReader::getStruct(&local_68,&local_38,(word *)0x0);
  uVar1 = Schema::getSchemaOffset(&this->super_Schema,(Reader *)&local_68);
  return uVar1;
}

Assistant:

uint32_t ConstSchema::getValueSchemaOffset() const {
  return getSchemaOffset(getProto().getConst().getValue());
}